

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::createCoordinatePath(Chromosome *this,Coordinate start)

{
  pointer pCVar1;
  TURNCODE *pTVar2;
  TURNCODE *pTVar3;
  Coordinate next;
  value_type local_40;
  value_type local_30;
  
  local_30.facing = start.facing;
  local_30._0_8_ = start._0_8_;
  pCVar1 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar1) {
    (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar1;
  }
  std::vector<Coordinate,_std::allocator<Coordinate>_>::push_back(&this->pathList,&local_30);
  pTVar2 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar3 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar3 != pTVar2; pTVar3 = pTVar3 + 1) {
    local_40.facing = local_30.facing;
    local_40.x = local_30.x;
    local_40.y = local_30.y;
    Coordinate::turnTo(&local_40,*pTVar3);
    std::vector<Coordinate,_std::allocator<Coordinate>_>::push_back(&this->pathList,&local_40);
    local_30.facing = local_40.facing;
    local_30.x = local_40.x;
    local_30.y = local_40.y;
  }
  return;
}

Assistant:

void Chromosome::createCoordinatePath(Coordinate start) {
    pathList.clear();
    Coordinate current = start;
    pathList.push_back(current);
    for (auto turn: turnList){
        Coordinate next = current;
        next.turnTo(turn);
        pathList.push_back(next);
        current = next;
    }
}